

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::ConvertToUnixSlashes(string *path)

{
  undefined1 *puVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  reference pcVar5;
  bool bVar6;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [8];
  ulong local_88;
  size_t size;
  passwd *local_70;
  passwd *pw;
  string user;
  size_type idx;
  char *homeEnv;
  size_type pos;
  char *pos1;
  char *pos0;
  bool hasDoubleSlash;
  char *pathCString;
  string *path_local;
  
  pos1 = (char *)std::__cxx11::string::c_str();
  bVar6 = false;
  pcVar3 = pos1;
  for (; pos = (long)pcVar3 + 1, *pos1 != '\0'; pos1 = pos1 + 1) {
    if ((*pos1 == '\\') && (*(char *)pos != ' ')) {
      puVar1 = (undefined1 *)std::__cxx11::string::operator[]((ulong)path);
      *puVar1 = 0x2f;
    }
    if (((*(char *)pos == '/') && (pcVar3[2] == '/')) && (!bVar6)) {
      bVar6 = true;
    }
    pcVar3 = (char *)pos;
  }
  if (bVar6) {
    ReplaceString(path,"//","/");
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    if ((*pcVar3 == '~') && ((pcVar3[1] == '/' || (pcVar3[1] == '\0')))) {
      pcVar3 = GetEnv("HOME");
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::replace((ulong)path,0,(char *)0x1);
      }
    }
    else if (*pcVar3 == '~') {
      user.field_2._8_8_ = std::__cxx11::string::find_first_of((char *)path,0x129270);
      std::__cxx11::string::substr((ulong)&pw,(ulong)path);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_70 = getpwnam(pcVar3);
      if (local_70 != (passwd *)0x0) {
        std::__cxx11::string::replace((ulong)path,0,(char *)user.field_2._8_8_);
      }
      std::__cxx11::string::~string((string *)&pw);
    }
    lVar4 = std::__cxx11::string::c_str();
    local_88 = std::__cxx11::string::size();
    bVar6 = false;
    if (1 < local_88) {
      std::__cxx11::string::rbegin();
      pcVar5 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(local_90);
      bVar6 = *pcVar5 == '/';
    }
    if ((bVar6) && ((local_88 != 3 || (*(char *)(lVar4 + 1) != ':')))) {
      std::__cxx11::string::resize((ulong)path);
    }
  }
  return;
}

Assistant:

void SystemTools::ConvertToUnixSlashes(std::string& path)
{
  const char* pathCString = path.c_str();
  bool hasDoubleSlash = false;
#ifdef __VMS
  ConvertVMSToUnix(path);
#else
  const char* pos0 = pathCString;
  const char* pos1 = pathCString+1;
  for (std::string::size_type pos = 0; *pos0; ++ pos )
    {
    // make sure we don't convert an escaped space to a unix slash
    if ( *pos0 == '\\' && *pos1 != ' ' )
      {
      path[pos] = '/';
      }

    // Also, reuse the loop to check for slash followed by another slash
    if (*pos1 == '/' && *(pos1+1) == '/' && !hasDoubleSlash)
      {
#ifdef _WIN32
      // However, on windows if the first characters are both slashes,
      // then keep them that way, so that network paths can be handled.
      if ( pos > 0)
        {
        hasDoubleSlash = true;
        }
#else
      hasDoubleSlash = true;
#endif
      }

    pos0 ++;
    pos1 ++;
    }

  if ( hasDoubleSlash )
    {
    SystemTools::ReplaceString(path, "//", "/");
    }
#endif
  // remove any trailing slash
  if(!path.empty())
    {
    // if there is a tilda ~ then replace it with HOME
    pathCString = path.c_str();
    if(pathCString[0] == '~' && (pathCString[1] == '/' || pathCString[1] == '\0'))
      {
      const char* homeEnv = SystemTools::GetEnv("HOME");
      if (homeEnv)
        {
        path.replace(0,1,homeEnv);
        }
      }
#ifdef HAVE_GETPWNAM
    else if(pathCString[0] == '~')
      {
      std::string::size_type idx = path.find_first_of("/\0");
      std::string user = path.substr(1, idx-1);
      passwd* pw = getpwnam(user.c_str());
      if(pw)
        {
        path.replace(0, idx, pw->pw_dir);
        }
      }
#endif
    // remove trailing slash if the path is more than
    // a single /
    pathCString = path.c_str();
    size_t size = path.size();
    if(size > 1 && *path.rbegin() == '/')
      {
      // if it is c:/ then do not remove the trailing slash
      if(!((size == 3 && pathCString[1] == ':')))
        {
        path.resize(size - 1);
        }
      }
    }
}